

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InlinePass::InlineEntryBlock
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block,
          DebugInlinedAtContext *inlined_at_ctx)

{
  bool bVar1;
  NonSemanticShaderDebugInfo100Instructions_conflict NVar2;
  uint32_t uVar3;
  Instruction *pIVar4;
  pointer new_blk_ptr_00;
  IRContext *this_00;
  DebugInfoManager *this_01;
  Instruction *this_02;
  DebugScope *this_03;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_itr;
  undefined1 local_60 [32];
  iterator callee_inst_itr;
  DebugInlinedAtContext *inlined_at_ctx_local;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  *new_blk_ptr_local;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *callee2caller_local;
  InlinePass *this_local;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> callee_first_block_local;
  
  local_60._16_8_ = callee_first_block.iterator_._M_current;
  local_60._8_8_ = callee_first_block.container_;
  callee_first_block_itr.iterator_._M_current =
       (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
       local_60._8_8_;
  callee_first_block_itr.container_ = (UptrVector *)new_blk_ptr;
  callee_inst_itr.super_iterator.node_ = (iterator)(iterator)inlined_at_ctx;
  this_local = (InlinePass *)local_60._8_8_;
  callee_first_block_local.container_ = (UptrVector *)local_60._16_8_;
  AddStoresForVariableInitializers
            ((InlinePass *)(local_60 + 0x18),
             (unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
              *)this,(DebugInlinedAtContext *)callee2caller,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)inlined_at_ctx,callee_first_block_itr);
  while( true ) {
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&this_local);
      BasicBlock::end((BasicBlock *)local_60);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_60 + 0x18),
                                (iterator_template<spvtools::opt::Instruction> *)local_60);
      if (!bVar1) {
        return true;
      }
      pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_60 + 0x18));
      NVar2 = opt::Instruction::GetShader100DebugOpcode(pIVar4);
      if (NVar2 != NonSemanticShaderDebugInfo100DebugFunctionDefinition) break;
      InstructionList::iterator::operator++((iterator *)(local_60 + 0x18));
    }
    new_blk_ptr_00 =
         std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ::get(new_blk_ptr);
    pIVar4 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)(local_60 + 0x18));
    this_00 = Pass::context(&this->super_Pass);
    this_01 = IRContext::get_debug_info_mgr(this_00);
    this_02 = utils::IntrusiveList<spvtools::opt::Instruction>::
              iterator_template<spvtools::opt::Instruction>::operator->
                        ((iterator_template<spvtools::opt::Instruction> *)(local_60 + 0x18));
    this_03 = opt::Instruction::GetDebugScope(this_02);
    uVar3 = DebugScope::GetInlinedAt(this_03);
    uVar3 = analysis::DebugInfoManager::BuildDebugInlinedAtChain
                      (this_01,uVar3,(DebugInlinedAtContext *)callee_inst_itr.super_iterator.node_);
    bVar1 = InlineSingleInstruction(this,callee2caller,new_blk_ptr_00,pIVar4,uVar3);
    if (!bVar1) break;
    InstructionList::iterator::operator++((iterator *)(local_60 + 0x18));
  }
  return false;
}

Assistant:

bool InlinePass::InlineEntryBlock(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::unique_ptr<BasicBlock>* new_blk_ptr,
    UptrVectorIterator<BasicBlock> callee_first_block,
    analysis::DebugInlinedAtContext* inlined_at_ctx) {
  auto callee_inst_itr = AddStoresForVariableInitializers(
      callee2caller, inlined_at_ctx, new_blk_ptr, callee_first_block);

  while (callee_inst_itr != callee_first_block->end()) {
    // Don't inline function definition links, the calling function is not a
    // definition.
    if (callee_inst_itr->GetShader100DebugOpcode() ==
        NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
      ++callee_inst_itr;
      continue;
    }

    if (!InlineSingleInstruction(
            callee2caller, new_blk_ptr->get(), &*callee_inst_itr,
            context()->get_debug_info_mgr()->BuildDebugInlinedAtChain(
                callee_inst_itr->GetDebugScope().GetInlinedAt(),
                inlined_at_ctx))) {
      return false;
    }
    ++callee_inst_itr;
  }
  return true;
}